

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

ip_chain_t * find_chain(char *name,ip_table_t *ipt)

{
  list_head *plVar1;
  int iVar2;
  list_head *__mptr_1;
  list_head *__mptr;
  ip_chain_t *p;
  int c;
  ip_table_t *ipt_local;
  char *name_local;
  
  iVar2 = map_int_get_v(name,m_chain);
  if ((iVar2 == 5) || (ipt->chains[iVar2] == (ip_chain_t *)0x0)) {
    for (plVar1 = (ipt->child_chains).next; __mptr = (list_head *)&plVar1[-3].prev,
        plVar1 != &ipt->child_chains; plVar1 = plVar1->next) {
      iVar2 = strcmp(name,(char *)__mptr);
      if (iVar2 == 0) {
        return (ip_chain_t *)__mptr;
      }
    }
    name_local = (char *)0x0;
  }
  else {
    name_local = ipt->chains[iVar2]->name;
  }
  return (ip_chain_t *)name_local;
}

Assistant:

static ip_chain_t *find_chain(const char *name, ip_table_t *ipt)
{
	int c = map_int_get_v(name, m_chain);
	ip_chain_t *p = NULL;

	if (c != CHAIN_NONE && ipt->chains[c] != NULL) {
		return ipt->chains[c];
	}

	list_for_each_entry(p, &ipt->child_chains, list) {
		if (strcmp(name, p->name) == 0) {
			return p;
		}
	}

	return NULL;
}